

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

string * testing::internal::StripTrailingSpaces(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  pointer pcVar2;
  pointer pcVar3;
  
  pcVar2 = (str->_M_dataplus)._M_p;
  pcVar3 = pcVar2 + str->_M_string_length;
  while (pcVar3 != pcVar2) {
    bVar1 = IsSpace(pcVar3[-1]);
    if (!bVar1) break;
    pcVar3 = (pointer)std::__cxx11::string::erase(str,pcVar3 + -1);
    pcVar2 = (str->_M_dataplus)._M_p;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

inline std::string StripTrailingSpaces(std::string str) {
  std::string::iterator it = str.end();
  while (it != str.begin() && IsSpace(*--it))
    it = str.erase(it);
  return str;
}